

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

HasSizeMatcher * Catch::Matchers::SizeIs(size_t sz)

{
  HasSizeMatcher *in_RSI;
  HasSizeMatcher *in_RDI;
  
  HasSizeMatcher::HasSizeMatcher(in_RSI,(size_t)in_RDI);
  return in_RDI;
}

Assistant:

HasSizeMatcher SizeIs(std::size_t sz) {
        return HasSizeMatcher{ sz };
    }